

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O0

void __thiscall
QPropertyAnimation::updateState(QPropertyAnimation *this,State newState,State oldState)

{
  bool bVar1;
  int iVar2;
  parameter_type pVar3;
  State SVar4;
  parameter_type pQVar5;
  char *pcVar6;
  QObject *this_00;
  arrow_operator_result ppQVar7;
  ushort *puVar8;
  QVariantAnimation *pQVar9;
  QAnimationGroup *pQVar10;
  State in_EDX;
  State in_ESI;
  QVariantAnimation *in_RDI;
  long in_FS_OFFSET;
  QAbstractAnimation *current;
  char *what;
  QPropertyAnimation *animToStop;
  QPropertyAnimationPrivate *d;
  QPropertyAnimationPair key;
  unique_lock<QBasicMutex> locker;
  pair<QObject_*,_QByteArray> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  pair<QObject_*,_QByteArray> *in_stack_fffffffffffffe10;
  QObject *in_stack_fffffffffffffe28;
  QPropertyAnimationPrivate *in_stack_fffffffffffffe40;
  byte local_1ad;
  undefined4 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5c;
  undefined1 in_stack_fffffffffffffe5d;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  byte local_19a;
  char *local_148;
  QPropertyAnimation *local_120;
  QMessageLogger local_e8;
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QMessageLogger local_98;
  undefined1 *local_78;
  undefined1 *local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPropertyAnimation *)0x683447);
  pQVar5 = ::QObjectCompatProperty::operator_cast_to_QObject_
                     ((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                       *)0x683463);
  if ((pQVar5 == (parameter_type)0x0) && (in_EDX == Stopped)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe10,
               (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               in_stack_fffffffffffffe04,(char *)in_stack_fffffffffffffdf8);
    QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
    ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
             *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    pcVar6 = QByteArray::constData((QByteArray *)0x6834a5);
    QMessageLogger::warning
              (&local_98,
               "QPropertyAnimation::updateState (%s): Changing state of an animation without target"
               ,pcVar6);
  }
  else {
    QVariantAnimation::updateState(in_RDI,in_ESI,in_EDX);
    local_120 = (QPropertyAnimation *)0x0;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    (anonymous_namespace)::qt_unique_lock<QBasicMutex,std::unique_lock<QBasicMutex>>
              ((QBasicMutex *)in_stack_fffffffffffffdf8);
    if ((updateState(QAbstractAnimation::State,QAbstractAnimation::State)::hash == '\0') &&
       (iVar2 = __cxa_guard_acquire(&updateState(QAbstractAnimation::State,QAbstractAnimation::State)
                                     ::hash), iVar2 != 0)) {
      __cxa_atexit(QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::~QHash,
                   &updateState::hash,&__dso_handle);
      __cxa_guard_release(&updateState(QAbstractAnimation::State,QAbstractAnimation::State)::hash);
    }
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    std::pair<QObject_*,_QByteArray>::
    pair<QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>_&,_QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>_&,_true>
              (in_stack_fffffffffffffe10,
               (QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               (QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    if (in_ESI == Running) {
      QPropertyAnimationPrivate::updateMetaProperty(in_stack_fffffffffffffe40);
      local_c0 = 0;
      local_120 = QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::value
                            ((QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)
                             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                             (pair<QObject_*,_QByteArray> *)
                             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                             (QPropertyAnimation **)in_stack_fffffffffffffdf8);
      QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::insert
                ((QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8,(QPropertyAnimation **)0x68362f);
      std::unique_lock<QBasicMutex>::unlock
                ((unique_lock<QBasicMutex> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      if (in_EDX == Stopped) {
        QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
        ::operator->((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                      *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
        ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        QByteArray::constData((QByteArray *)0x6836d9);
        QObject::property(in_stack_fffffffffffffe28,
                          (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                           CONCAT16(in_stack_fffffffffffffe5e,
                                                    CONCAT15(in_stack_fffffffffffffe5d,
                                                             CONCAT14(in_stack_fffffffffffffe5c,
                                                                      in_stack_fffffffffffffe58)))))
        ;
        QVariantAnimationPrivate::setDefaultStartEndValue
                  ((QVariantAnimationPrivate *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (QVariant *)in_stack_fffffffffffffdf8);
        ::QVariant::~QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        local_148 = (char *)0x0;
        QVariantAnimation::startValue((QVariantAnimation *)in_stack_fffffffffffffdf8);
        bVar1 = ::QVariant::isValid((QVariant *)
                                    CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        local_19a = 0;
        if (!bVar1) {
          pVar3 = ::QObjectCompatProperty::operator_cast_to_Direction
                            ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                              *)0x68376c);
          local_19a = 1;
          if (pVar3 != Backward) {
            bVar1 = ::QVariant::isValid((QVariant *)
                                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00
                                                ));
            local_19a = bVar1 ^ 0xff;
          }
        }
        ::QVariant::~QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        if ((local_19a & 1) != 0) {
          local_148 = "start";
        }
        QVariantAnimation::endValue((QVariantAnimation *)in_stack_fffffffffffffdf8);
        bVar1 = ::QVariant::isValid((QVariant *)
                                    CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        local_1ad = 0;
        if (!bVar1) {
          pVar3 = ::QObjectCompatProperty::operator_cast_to_Direction
                            ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                              *)0x6838bd);
          local_1ad = 1;
          if (pVar3 != Forward) {
            bVar1 = ::QVariant::isValid((QVariant *)
                                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00
                                                ));
            local_1ad = bVar1 ^ 0xff;
          }
        }
        ::QVariant::~QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        if ((local_1ad & 1) != 0) {
          if (local_148 == (char *)0x0) {
            local_148 = "end";
          }
          else {
            local_148 = "start and end";
          }
        }
        if (local_148 != (char *)0x0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffe10,
                     (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                     in_stack_fffffffffffffe04,(char *)in_stack_fffffffffffffdf8);
          QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
          ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                   *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          this_00 = (QObject *)QByteArray::constData((QByteArray *)0x6839c8);
          ppQVar7 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                    ::operator->((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                                  *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          (**(*ppQVar7)->_vptr_QObject)();
          pcVar6 = QMetaObject::className((QMetaObject *)in_stack_fffffffffffffdf8);
          QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
          ::operator->((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                        *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          QObject::objectName(this_00);
          QtPrivate::asString((QString *)&stack0xffffffffffffff00);
          puVar8 = QString::utf16((QString *)
                                  CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          QMessageLogger::warning
                    (&local_e8,
                     "QPropertyAnimation::updateState (%s, %s, %ls): starting an animation without %s value"
                     ,this_00,pcVar6,puVar8,local_148);
          QString::~QString((QString *)0x683aa3);
        }
      }
    }
    else {
      pQVar9 = (QVariantAnimation *)
               QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::value
                         ((QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)
                          CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                          (pair<QObject_*,_QByteArray> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      if (pQVar9 == in_RDI) {
        QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::remove
                  (&updateState::hash,(char *)&local_b8);
      }
    }
    std::pair<QObject_*,_QByteArray>::~pair((pair<QObject_*,_QByteArray> *)0x683b1b);
    std::unique_lock<QBasicMutex>::~unique_lock
              ((unique_lock<QBasicMutex> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    if (local_120 != (QPropertyAnimation *)0x0) {
      while( true ) {
        pQVar10 = QAbstractAnimation::group
                            ((QAbstractAnimation *)
                             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        bVar1 = false;
        if (pQVar10 != (QAnimationGroup *)0x0) {
          SVar4 = QAbstractAnimation::state
                            ((QAbstractAnimation *)
                             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          bVar1 = SVar4 != Stopped;
        }
        if (!bVar1) break;
        QAbstractAnimation::group
                  ((QAbstractAnimation *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      }
      QAbstractAnimation::stop
                ((QAbstractAnimation *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyAnimation::updateState(QAbstractAnimation::State newState,
                                     QAbstractAnimation::State oldState)
{
    Q_D(QPropertyAnimation);

    if (!d->targetObject && oldState == Stopped) {
        qWarning("QPropertyAnimation::updateState (%s): Changing state of an animation without "
                 "target",
                 d->propertyName.value().constData());
        return;
    }

    QVariantAnimation::updateState(newState, oldState);

    QPropertyAnimation *animToStop = nullptr;
    {
        Q_CONSTINIT static QBasicMutex mutex;
        auto locker = qt_unique_lock(mutex);
        using QPropertyAnimationPair = std::pair<QObject *, QByteArray>;
        typedef QHash<QPropertyAnimationPair, QPropertyAnimation*> QPropertyAnimationHash;
        Q_CONSTINIT static QPropertyAnimationHash hash;

        // in case the targetObject gets deleted, the following happens:
        // 1. targetObject's destroyed signal calls our targetObjectDestroyed.
        // 2. targetObjectDestroyed calls stop()
        // 3. QAbstractAnimation::stop() calls setState(Stopped)
        // 4. setState(Stopped) calls updateState(newState, oldState)
        // 5. we arrive here. d->targetObject is not yet set to nullptr, we can safely use it.
        Q_ASSERT(d->targetObject);

        QPropertyAnimationPair key(d->targetObject, d->propertyName);
        if (newState == Running) {
            d->updateMetaProperty();
            animToStop = hash.value(key, nullptr);
            hash.insert(key, this);
            locker.unlock();
            // update the default start value
            if (oldState == Stopped) {
                d->setDefaultStartEndValue(
                        d->targetObject->property(d->propertyName.value().constData()));
                //let's check if we have a start value and an end value
                const char *what = nullptr;
                if (!startValue().isValid() && (d->direction == Backward || !d->defaultStartEndValue.isValid())) {
                    what = "start";
                }
                if (!endValue().isValid() && (d->direction == Forward || !d->defaultStartEndValue.isValid())) {
                    if (what)
                        what = "start and end";
                    else
                        what = "end";
                }
                if (Q_UNLIKELY(what)) {
                    qWarning("QPropertyAnimation::updateState (%s, %s, %ls): starting an animation "
                             "without %s value",
                             d->propertyName.value().constData(),
                             d->targetObject->metaObject()->className(),
                             qUtf16Printable(d->targetObject->objectName()), what);
                }
            }
        } else if (hash.value(key) == this) {
            hash.remove(key);
        }
    }

    //we need to do that after the mutex was unlocked
    if (animToStop) {
        // try to stop the top level group
        QAbstractAnimation *current = animToStop;
        while (current->group() && current->state() != Stopped)
            current = current->group();
        current->stop();
    }
}